

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O0

void __thiscall spirv_cross::CFG::build_immediate_dominators(CFG *this)

{
  mapped_type mVar1;
  bool bVar2;
  uint32_t uVar3;
  mapped_type *pmVar4;
  uint *puVar5;
  mapped_type *this_00;
  uint *edge;
  uint *__end2;
  uint *__begin2;
  mapped_type *__range2;
  mapped_type *pred;
  size_t sStack_20;
  uint32_t block;
  size_t i;
  CFG *local_10;
  CFG *this_local;
  
  local_10 = this;
  ::std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::clear(&this->immediate_dominators);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->func->entry_block);
  i._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->func->entry_block);
  pmVar4 = ::std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->immediate_dominators,(key_type *)((long)&i + 4));
  *pmVar4 = uVar3;
  sStack_20 = VectorView<unsigned_int>::size(&(this->post_order).super_VectorView<unsigned_int>);
  do {
    if (sStack_20 == 0) {
      return;
    }
    puVar5 = VectorView<unsigned_int>::operator[]
                       (&(this->post_order).super_VectorView<unsigned_int>,sStack_20 - 1);
    pred._4_4_ = *puVar5;
    this_00 = ::std::
              unordered_map<unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>_>
              ::operator[](&this->preceding_edges,(key_type *)((long)&pred + 4));
    bVar2 = VectorView<unsigned_int>::empty(&this_00->super_VectorView<unsigned_int>);
    if (!bVar2) {
      __end2 = VectorView<unsigned_int>::begin(&this_00->super_VectorView<unsigned_int>);
      puVar5 = VectorView<unsigned_int>::end(&this_00->super_VectorView<unsigned_int>);
      for (; __end2 != puVar5; __end2 = __end2 + 1) {
        pmVar4 = ::std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->immediate_dominators,(key_type *)((long)&pred + 4));
        if (*pmVar4 == 0) {
          mVar1 = *__end2;
          pmVar4 = ::std::
                   unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::operator[](&this->immediate_dominators,(key_type *)((long)&pred + 4));
          *pmVar4 = mVar1;
        }
        else {
          pmVar4 = ::std::
                   unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::operator[](&this->immediate_dominators,__end2);
          if (*pmVar4 == 0) {
            __assert_fail("immediate_dominators[edge]",
                          "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_cfg.cpp"
                          ,0x46,"void spirv_cross::CFG::build_immediate_dominators()");
          }
          pmVar4 = ::std::
                   unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::operator[](&this->immediate_dominators,(key_type *)((long)&pred + 4));
          uVar3 = find_common_dominator(this,*pmVar4,*__end2);
          pmVar4 = ::std::
                   unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::operator[](&this->immediate_dominators,(key_type *)((long)&pred + 4));
          *pmVar4 = uVar3;
        }
      }
    }
    sStack_20 = sStack_20 - 1;
  } while( true );
}

Assistant:

void CFG::build_immediate_dominators()
{
	// Traverse the post-order in reverse and build up the immediate dominator tree.
	immediate_dominators.clear();
	immediate_dominators[func.entry_block] = func.entry_block;

	for (auto i = post_order.size(); i; i--)
	{
		uint32_t block = post_order[i - 1];
		auto &pred = preceding_edges[block];
		if (pred.empty()) // This is for the entry block, but we've already set up the dominators.
			continue;

		for (auto &edge : pred)
		{
			if (immediate_dominators[block])
			{
				assert(immediate_dominators[edge]);
				immediate_dominators[block] = find_common_dominator(immediate_dominators[block], edge);
			}
			else
				immediate_dominators[block] = edge;
		}
	}
}